

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  ConfigData *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Config_001fa038;
  TestSpec::~TestSpec((TestSpec *)0x18e12d);
  std::unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>::~unique_ptr
            ((unique_ptr<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_> *)in_RDI)
  ;
  ConfigData::~ConfigData(in_RDI);
  SharedImpl<Catch::IConfig>::~SharedImpl((SharedImpl<Catch::IConfig> *)0x18e156);
  return;
}

Assistant:

virtual ~Config() {
        }